

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O0

void __thiscall
Projection::computeRhoG
          (Projection *this,FArrayBox *rhoFab,FArrayBox *phiFab,Geometry *geom,Orientation *outFaces
          ,int numOutFlowFaces,Real gravity)

{
  int iVar1;
  Geometry *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  bool bVar2;
  Real in_XMM0_Qa;
  int k_27;
  int k_26;
  int k_25;
  Real rhog_11;
  int i_7;
  int k_24;
  int k_23;
  int k_22;
  Real rhog_10;
  int i_6;
  int k_21;
  Real rhog_9;
  int i_5;
  int k_20;
  int k_19;
  int k_18;
  Real rhog_8;
  int i_4;
  int k_17;
  int k_16;
  int k_15;
  Real rhog_7;
  int i_3;
  int k_14;
  Real rhog_6;
  int i_2;
  int ihi;
  int ilo;
  bool has_foextrap_hi_1;
  bool has_foextrap_lo_1;
  bool has_hoextrap_hi_1;
  bool has_hoextrap_lo_1;
  bool has_extdir_hi_1;
  bool has_extdir_lo_1;
  int j_6;
  int k_13;
  int k_12;
  int k_11;
  Real rhog_5;
  int j_5;
  int k_10;
  int k_9;
  int k_8;
  Real rhog_4;
  int j_4;
  int k_7;
  Real rhog_3;
  int j_3;
  int k_6;
  int k_5;
  int k_4;
  Real rhog_2;
  int j_2;
  int k_3;
  int k_2;
  int k_1;
  Real rhog_1;
  int j_1;
  int k;
  Real rhog;
  int j;
  int jhi;
  int jlo;
  bool has_foextrap_hi;
  bool has_foextrap_lo;
  bool has_hoextrap_hi;
  bool has_hoextrap_lo;
  bool has_extdir_hi;
  bool has_extdir_lo;
  int i_1;
  Real rho_ii;
  Real rho_i;
  int *hbc;
  int *lbc;
  int i;
  int hi_bc [3];
  int lo_bc [3];
  Dim3 domhi;
  Dim3 domlo;
  Box *domain;
  anon_class_16_2_2e1508ad add_rhog;
  Real dh;
  Array4<double> *rho;
  Array4<double> *phi;
  Dim3 hi;
  Dim3 lo;
  Side side;
  int outDir;
  int iface;
  bool local_108c;
  bool local_108b;
  bool local_108a;
  bool local_1089;
  bool local_1088;
  bool local_1087;
  bool local_1086;
  bool local_1085;
  bool local_1084;
  bool local_1083;
  bool local_1082;
  bool local_1081;
  Array4<double> *in_stack_ffffffffffffef80;
  int local_1064;
  int local_1060;
  int local_105c;
  Real local_1058;
  int local_1050;
  int local_104c;
  int local_1048;
  int local_1044;
  Real local_1040;
  int local_1038;
  int local_1034;
  Real local_1030;
  int local_1028;
  int local_1024;
  int local_1020;
  int local_101c;
  Real local_1018;
  int local_1010;
  int local_100c;
  int local_1008;
  int local_1004;
  Real local_1000;
  int local_ff8;
  int local_ff4;
  Real local_ff0;
  int local_fe4;
  int local_fe0;
  int local_fdc;
  bool local_fd6;
  bool local_fd5;
  bool local_fd4;
  bool local_fd3;
  bool local_fd2;
  bool local_fd1;
  int local_fd0;
  int local_fcc;
  int local_fc8;
  int local_fc4;
  Real local_fc0;
  int local_fb8;
  int local_fb4;
  int local_fb0;
  int local_fac;
  Real local_fa8;
  int local_fa0;
  int local_f9c;
  Real local_f98;
  int local_f90;
  int local_f8c;
  int local_f88;
  int local_f84;
  Real local_f80;
  int local_f78;
  int local_f74;
  int local_f70;
  int local_f6c;
  Real local_f68;
  int local_f60;
  int local_f5c;
  Real local_f58;
  int local_f50;
  int local_f4c;
  int local_f48;
  bool local_f42;
  bool local_f41;
  bool local_f40;
  bool local_f3f;
  bool local_f3e;
  bool local_f3d;
  int local_f3c;
  Real local_f38;
  Real local_f30;
  long local_f28;
  long local_f20;
  int local_f14;
  int local_f10 [6];
  undefined8 local_ef8;
  int local_ef0;
  undefined8 local_ee4;
  int local_edc;
  undefined8 local_ed8;
  int local_ed0;
  undefined8 local_ec8;
  int local_ec0;
  Box *local_eb8;
  anon_class_16_2_2e1508ad local_eb0;
  Real local_ea0;
  Array4<double> local_e98;
  Array4<double> *local_e58;
  Array4<double> local_e50;
  Array4<double> *local_e10;
  undefined8 local_e08;
  int local_e00;
  undefined8 local_df8;
  int local_df0;
  undefined8 local_de8;
  int local_de0;
  undefined8 local_dd8;
  int local_dd0;
  Side local_dcc;
  int local_dc8;
  int local_dc4;
  Real local_dc0;
  int local_db4;
  long local_db0;
  Geometry *local_da8;
  long local_da0;
  long local_d98;
  char *local_d88;
  long local_d80;
  long local_d78;
  undefined8 local_d70;
  int local_d68;
  Box *local_d60;
  int local_d54;
  int iStack_d50;
  int local_d4c;
  undefined8 local_d48;
  int local_d40;
  Box *local_d38;
  int local_d2c;
  int iStack_d28;
  int local_d24;
  undefined8 local_d20;
  int local_d18;
  Box *local_d10;
  int local_d04;
  int iStack_d00;
  int local_cfc;
  undefined8 local_cf8;
  int local_cf0;
  Box *local_ce8;
  int local_cdc;
  int iStack_cd8;
  int local_cd4;
  long local_cd0;
  long local_cc8;
  int local_cbc;
  int local_cb8;
  int local_cb4;
  Array4<double> *local_cb0;
  int local_ca4;
  int local_ca0;
  int local_c9c;
  Array4<double> *local_c98;
  int local_c8c;
  int local_c88;
  int local_c84;
  Array4<double> *local_c80;
  int local_c74;
  int local_c70;
  int local_c6c;
  Array4<double> *local_c68;
  int local_c5c;
  int local_c58;
  int local_c54;
  Array4<double> *local_c50;
  int local_c44;
  int local_c40;
  int local_c3c;
  Array4<double> *local_c38;
  int local_c2c;
  int local_c28;
  int local_c24;
  Array4<double> *local_c20;
  int local_c14;
  int local_c10;
  int local_c0c;
  Array4<double> *local_c08;
  int local_bfc;
  int local_bf8;
  int local_bf4;
  Array4<double> *local_bf0;
  int local_be4;
  int local_be0;
  int local_bdc;
  Array4<double> *local_bd8;
  int local_bcc;
  int local_bc8;
  int local_bc4;
  Array4<double> *local_bc0;
  int local_bb4;
  int local_bb0;
  int local_bac;
  Array4<double> *local_ba8;
  int local_b9c;
  int local_b98;
  int local_b94;
  Array4<double> *local_b90;
  int local_b84;
  int local_b80;
  int local_b7c;
  Array4<double> *local_b78;
  int local_b6c;
  int local_b68;
  int local_b64;
  Array4<double> *local_b60;
  int local_b54;
  int local_b50;
  int local_b4c;
  Array4<double> *local_b48;
  int local_b3c;
  int local_b38;
  int local_b34;
  Array4<double> *local_b30;
  int local_b24;
  int local_b20;
  int local_b1c;
  Array4<double> *local_b18;
  int local_b0c;
  int local_b08;
  int local_b04;
  Array4<double> *local_b00;
  int local_af4;
  int local_af0;
  int local_aec;
  Array4<double> *local_ae8;
  int local_adc;
  int local_ad8;
  int local_ad4;
  Array4<double> *local_ad0;
  int local_ac4;
  int local_ac0;
  int local_abc;
  Array4<double> *local_ab8;
  int local_aac;
  int local_aa8;
  int local_aa4;
  Array4<double> *local_aa0;
  int local_a94;
  int local_a90;
  int local_a8c;
  Array4<double> *local_a88;
  int local_a7c;
  int local_a78;
  int local_a74;
  Array4<double> *local_a70;
  int local_a64;
  int local_a60;
  int local_a5c;
  Array4<double> *local_a58;
  int local_a4c;
  int local_a48;
  int local_a44;
  Array4<double> *local_a40;
  int local_a34;
  int local_a30;
  int local_a2c;
  Array4<double> *local_a28;
  int local_a1c;
  int local_a18;
  int local_a14;
  Array4<double> *local_a10;
  int local_a04;
  int local_a00;
  int local_9fc;
  Array4<double> *local_9f8;
  int local_9ec;
  int local_9e8;
  int local_9e4;
  Array4<double> *local_9e0;
  int local_9d4;
  int local_9d0;
  int local_9cc;
  Array4<double> *local_9c8;
  int local_9bc;
  int local_9b8;
  int local_9b4;
  Array4<double> *local_9b0;
  int local_9a4;
  int local_9a0;
  int local_99c;
  Array4<double> *local_998;
  int local_98c;
  int local_988;
  int local_984;
  Array4<double> *local_980;
  int local_974;
  int local_970;
  int local_96c;
  Array4<double> *local_968;
  int local_95c;
  int local_958;
  int local_954;
  Array4<double> *local_950;
  int local_944;
  int local_940;
  int local_93c;
  Array4<double> *local_938;
  int local_92c;
  int local_928;
  int local_924;
  Array4<double> *local_920;
  int local_914;
  int local_910;
  int local_90c;
  Array4<double> *local_908;
  int local_8fc;
  int local_8f8;
  int local_8f4;
  Array4<double> *local_8f0;
  int local_8e4;
  int local_8e0;
  int local_8dc;
  Array4<double> *local_8d8;
  int local_8cc;
  int local_8c8;
  int local_8c4;
  Array4<double> *local_8c0;
  int local_8b4;
  int local_8b0;
  int local_8ac;
  Array4<double> *local_8a8;
  int local_89c;
  int local_898;
  int local_894;
  Array4<double> *local_890;
  int local_884;
  int local_880;
  int local_87c;
  Array4<double> *local_878;
  int local_86c;
  int local_868;
  int local_864;
  Array4<double> *local_860;
  int local_854;
  int local_850;
  int local_84c;
  Array4<double> *local_848;
  int local_83c;
  int local_838;
  int local_834;
  Array4<double> *local_830;
  int local_824;
  int local_820;
  int local_81c;
  Array4<double> *local_818;
  int local_80c;
  int local_808;
  int local_804;
  Array4<double> *local_800;
  int local_7f4;
  int local_7f0;
  int local_7ec;
  Array4<double> *local_7e8;
  int local_7dc;
  int local_7d8;
  int local_7d4;
  Array4<double> *local_7d0;
  int local_7c4;
  int local_7c0;
  int local_7bc;
  Array4<double> *local_7b8;
  int local_7ac;
  int local_7a8;
  int local_7a4;
  Array4<double> *local_7a0;
  int local_794;
  int local_790;
  int local_78c;
  Array4<double> *local_788;
  int local_77c;
  int local_778;
  int local_774;
  Array4<double> *local_770;
  int local_764;
  int local_760;
  int local_75c;
  Array4<double> *local_758;
  int local_74c;
  int local_748;
  int local_744;
  Array4<double> *local_740;
  int local_734;
  int local_730;
  int local_72c;
  Array4<double> *local_728;
  int local_71c;
  int local_718;
  int local_714;
  Array4<double> *local_710;
  int local_704;
  int local_700;
  int local_6fc;
  Array4<double> *local_6f8;
  int local_6ec;
  int local_6e8;
  int local_6e4;
  Array4<double> *local_6e0;
  int local_6d4;
  int local_6d0;
  int local_6cc;
  Array4<double> *local_6c8;
  int local_6bc;
  int local_6b8;
  int local_6b4;
  Array4<double> *local_6b0;
  int local_6a4;
  int local_6a0;
  int local_69c;
  Array4<double> *local_698;
  int local_68c;
  int local_688;
  int local_684;
  Array4<double> *local_680;
  int local_674;
  int local_670;
  int local_66c;
  Array4<double> *local_668;
  int local_65c;
  int local_658;
  int local_654;
  Array4<double> *local_650;
  int local_644;
  int local_640;
  int local_63c;
  Array4<double> *local_638;
  int local_62c;
  int local_628;
  int local_624;
  Array4<double> *local_620;
  int local_614;
  int local_610;
  int local_60c;
  Array4<double> *local_608;
  int local_5fc;
  int local_5f8;
  int local_5f4;
  Array4<double> *local_5f0;
  int local_5e4;
  int local_5e0;
  int local_5dc;
  Array4<double> *local_5d8;
  int local_5cc;
  int local_5c8;
  int local_5c4;
  Array4<double> *local_5c0;
  int local_5b4;
  int local_5b0;
  int local_5ac;
  Array4<double> *local_5a8;
  int local_59c;
  int local_598;
  int local_594;
  Array4<double> *local_590;
  int local_584;
  int local_580;
  int local_57c;
  Array4<double> *local_578;
  int local_56c;
  int local_568;
  int local_564;
  Array4<double> *local_560;
  int local_554;
  int local_550;
  int local_54c;
  Array4<double> *local_548;
  int local_53c;
  int local_538;
  int local_534;
  Array4<double> *local_530;
  int local_524;
  int local_520;
  int local_51c;
  Array4<double> *local_518;
  int local_50c;
  int local_508;
  int local_504;
  Array4<double> *local_500;
  int local_4f4;
  int local_4f0;
  int local_4ec;
  Array4<double> *local_4e8;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  Array4<double> *local_4d0;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  Array4<double> *local_4b8;
  int local_4ac;
  int local_4a8;
  int local_4a4;
  Array4<double> *local_4a0;
  int local_494;
  int local_490;
  int local_48c;
  Array4<double> *local_488;
  int local_47c;
  int local_478;
  int local_474;
  Array4<double> *local_470;
  int local_464;
  int local_460;
  int local_45c;
  Array4<double> *local_458;
  int local_44c;
  int local_448;
  int local_444;
  Array4<double> *local_440;
  int local_434;
  int local_430;
  int local_42c;
  Array4<double> *local_428;
  int local_41c;
  int local_418;
  int local_414;
  Array4<double> *local_410;
  int local_404;
  int local_400;
  int local_3fc;
  Array4<double> *local_3f8;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  Array4<double> *local_3e0;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  Array4<double> *local_3c8;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  Array4<double> *local_3b0;
  int local_3a4;
  int local_3a0;
  int local_39c;
  Array4<double> *local_398;
  int local_38c;
  int local_388;
  int local_384;
  Array4<double> *local_380;
  int local_374;
  int local_370;
  int local_36c;
  Array4<double> *local_368;
  int local_35c;
  int local_358;
  int local_354;
  Array4<double> *local_350;
  int local_344;
  int local_340;
  int local_33c;
  Array4<double> *local_338;
  int local_32c;
  int local_328;
  int local_324;
  Array4<double> *local_320;
  int local_314;
  int local_310;
  int local_30c;
  Array4<double> *local_308;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  Array4<double> *local_2f0;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  Array4<double> *local_2d8;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  Array4<double> *local_2c0;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  Array4<double> *local_2a8;
  undefined4 local_29c;
  IntVect *local_298;
  undefined4 local_28c;
  IntVect *local_288;
  undefined4 local_27c;
  IntVect *local_278;
  undefined4 local_26c;
  IntVect *local_268;
  undefined4 local_25c;
  IntVect *local_258;
  undefined4 local_24c;
  IntVect *local_248;
  undefined4 local_23c;
  Box *local_238;
  undefined4 local_22c;
  Box *local_228;
  undefined4 local_21c;
  Box *local_218;
  undefined4 local_20c;
  Box *local_208;
  undefined4 local_1fc;
  Box *local_1f8;
  undefined4 local_1ec;
  Box *local_1e8;
  Dim3 local_1e0;
  Dim3 local_1d0;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  undefined8 *local_1a0;
  double *local_198;
  Dim3 local_190;
  undefined8 *local_180;
  undefined4 local_178;
  undefined4 uStack_174;
  int local_170;
  undefined4 local_16c;
  undefined8 *local_168;
  undefined4 local_15c;
  undefined8 *local_158;
  undefined4 local_14c;
  undefined8 *local_148;
  Dim3 local_140;
  undefined8 *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  long local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  int *local_f8;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  undefined8 *local_b0;
  double *local_a8;
  Dim3 local_a0;
  undefined8 *local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  int local_80;
  undefined4 local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  undefined8 *local_58;
  Dim3 local_50;
  undefined8 *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  int *local_8;
  
  local_dc0 = in_XMM0_Qa;
  local_db4 = in_R9D;
  local_db0 = in_R8;
  local_da8 = in_RCX;
  local_da0 = in_RDX;
  local_d98 = in_RSI;
  for (local_dc4 = 0; local_dc4 < local_db4; local_dc4 = local_dc4 + 1) {
    local_dc8 = amrex::Orientation::coordDir((Orientation *)(local_db0 + (long)local_dc4 * 4));
    local_dcc = amrex::Orientation::faceDir((Orientation *)(local_db0 + (long)local_dc4 * 4));
    if (local_dc8 == 2) {
      if (local_dcc != high) {
        local_d88 = 
        "Projection::computeRhoG : Simulation box has outflow boundary condition on the bottom and gravity != 0. If this is really the desired configuration, just comment out this Abort"
        ;
        amrex::Abort_host((char *)in_stack_ffffffffffffef80);
      }
    }
    else {
      local_d38 = amrex::BaseFab<double>::box
                            ((BaseFab<double> *)(local_da0 + (long)local_dc4 * 0x48));
      local_21c = 0;
      local_d2c = (local_d38->smallend).vect[0];
      local_22c = 1;
      iStack_d28 = (local_d38->smallend).vect[1];
      local_de8 = *(undefined8 *)(local_d38->smallend).vect;
      local_23c = 2;
      local_de0 = (local_d38->smallend).vect[2];
      local_dd8 = local_de8;
      local_dd0 = local_de0;
      local_d48 = local_de8;
      local_d40 = local_de0;
      local_d24 = local_de0;
      local_238 = local_d38;
      local_228 = local_d38;
      local_218 = local_d38;
      local_ce8 = amrex::BaseFab<double>::box
                            ((BaseFab<double> *)(local_da0 + (long)local_dc4 * 0x48));
      local_278 = &local_ce8->bigend;
      local_27c = 0;
      local_cdc = local_278->vect[0];
      local_288 = &local_ce8->bigend;
      local_28c = 1;
      iStack_cd8 = (local_ce8->bigend).vect[1];
      local_e08 = *(undefined8 *)local_278->vect;
      local_298 = &local_ce8->bigend;
      local_29c = 2;
      local_e00 = (local_ce8->bigend).vect[2];
      local_d78 = local_da0 + (long)local_dc4 * 0x48;
      local_198 = *(double **)(local_d78 + 0x10);
      local_1a0 = (undefined8 *)(local_d78 + 0x18);
      local_1a4 = *(int *)(local_d78 + 0x34);
      local_14c = 0;
      local_178 = *(undefined4 *)local_1a0;
      local_15c = 1;
      uStack_174 = *(undefined4 *)(local_d78 + 0x1c);
      local_1c0._0_8_ = *local_1a0;
      local_16c = 2;
      local_1c0.z = *(int *)(local_d78 + 0x20);
      local_f8 = (int *)(local_d78 + 0x24);
      local_fc = 0;
      local_128 = *local_f8 + 1;
      local_108 = local_d78 + 0x24;
      local_10c = 1;
      iStack_124 = *(int *)(local_d78 + 0x28) + 1;
      local_118 = local_d78 + 0x24;
      local_11c = 2;
      local_1e0.z = *(int *)(local_d78 + 0x2c) + 1;
      local_1e0.y = iStack_124;
      local_1e0.x = local_128;
      in_stack_ffffffffffffef80 = &local_e50;
      local_df8 = local_e08;
      local_df0 = local_e00;
      local_cf8 = local_e08;
      local_cf0 = local_e00;
      local_cd4 = local_e00;
      local_1d0._0_8_ = local_1e0._0_8_;
      local_1d0.z = local_1e0.z;
      local_1b0._0_8_ = local_1c0._0_8_;
      local_1b0.z = local_1c0.z;
      local_190._0_8_ = local_1c0._0_8_;
      local_190.z = local_1c0.z;
      local_180 = local_1a0;
      local_170 = local_1c0.z;
      local_168 = local_1a0;
      local_158 = local_1a0;
      local_148 = local_1a0;
      local_140._0_8_ = local_1e0._0_8_;
      local_140.z = local_1e0.z;
      local_130 = local_1a0;
      local_120 = local_1e0.z;
      amrex::Array4<double>::Array4
                (in_stack_ffffffffffffef80,local_198,&local_1b0,&local_1d0,local_1a4);
      local_d80 = local_d98 + (long)local_dc4 * 0x48;
      local_a8 = *(double **)(local_d80 + 0x10);
      local_b0 = (undefined8 *)(local_d80 + 0x18);
      local_b4 = *(int *)(local_d80 + 0x34);
      local_5c = 0;
      local_88 = *(undefined4 *)local_b0;
      local_6c = 1;
      uStack_84 = *(undefined4 *)(local_d80 + 0x1c);
      local_d0._0_8_ = *local_b0;
      local_7c = 2;
      local_d0.z = *(int *)(local_d80 + 0x20);
      local_8 = (int *)(local_d80 + 0x24);
      local_c = 0;
      local_38 = *local_8 + 1;
      local_18 = local_d80 + 0x24;
      local_1c = 1;
      iStack_34 = *(int *)(local_d80 + 0x28) + 1;
      local_28 = local_d80 + 0x24;
      local_2c = 2;
      local_f0.z = *(int *)(local_d80 + 0x2c) + 1;
      local_f0.y = iStack_34;
      local_f0.x = local_38;
      local_e10 = in_stack_ffffffffffffef80;
      local_e0._0_8_ = local_f0._0_8_;
      local_e0.z = local_f0.z;
      local_c0._0_8_ = local_d0._0_8_;
      local_c0.z = local_d0.z;
      local_a0._0_8_ = local_d0._0_8_;
      local_a0.z = local_d0.z;
      local_90 = local_b0;
      local_80 = local_d0.z;
      local_78 = local_b0;
      local_68 = local_b0;
      local_58 = local_b0;
      local_50._0_8_ = local_f0._0_8_;
      local_50.z = local_f0.z;
      local_40 = local_b0;
      local_30 = local_f0.z;
      amrex::Array4<double>::Array4(&local_e98,local_a8,&local_c0,&local_e0,local_b4);
      local_e58 = &local_e98;
      local_eb0.dh = amrex::CoordSys::CellSize(&local_da8->super_CoordSys,2);
      local_eb0.gravity = local_dc0;
      local_ea0 = local_eb0.dh;
      local_eb8 = amrex::Geometry::Domain(local_da8);
      local_1ec = 0;
      local_d54 = (local_eb8->smallend).vect[0];
      local_1fc = 1;
      iStack_d50 = (local_eb8->smallend).vect[1];
      local_ed8 = *(undefined8 *)(local_eb8->smallend).vect;
      local_20c = 2;
      local_ed0 = (local_eb8->smallend).vect[2];
      local_248 = &local_eb8->bigend;
      local_24c = 0;
      local_d04 = local_248->vect[0];
      local_258 = &local_eb8->bigend;
      local_25c = 1;
      iStack_d00 = (local_eb8->bigend).vect[1];
      local_ef8 = *(undefined8 *)local_248->vect;
      local_268 = &local_eb8->bigend;
      local_26c = 2;
      local_ef0 = (local_eb8->bigend).vect[2];
      for (local_f14 = 0; local_f14 < 3; local_f14 = local_f14 + 1) {
        local_f20 = *(long *)(in_RDI + 0x58);
        local_cc8 = *(long *)(in_RDI + 0x58);
        local_f28 = local_cc8 + 0xc;
        local_f10[(long)local_f14 + 3] = scalar_bc[*(int *)(local_f20 + (long)local_f14 * 4)];
        local_f10[local_f14] = scalar_bc[*(int *)(local_f28 + (long)local_f14 * 4)];
        local_cd0 = local_f20;
      }
      local_ee4 = local_ef8;
      local_edc = local_ef0;
      local_ec8 = local_ed8;
      local_ec0 = local_ed0;
      local_d70 = local_ed8;
      local_d68 = local_ed0;
      local_d60 = local_eb8;
      local_d4c = local_ed0;
      local_d20 = local_ef8;
      local_d18 = local_ef0;
      local_d10 = local_eb8;
      local_cfc = local_ef0;
      local_208 = local_eb8;
      local_1f8 = local_eb8;
      local_1e8 = local_eb8;
      if (local_dc8 == 0) {
        local_f3c = (int)local_dd8;
        local_1081 = local_dd8._4_4_ == iStack_d50 && local_f10[4] == 3;
        local_f3d = local_1081;
        local_1082 = local_df8._4_4_ == iStack_d00 + 1 && local_f10[1] == 3;
        local_f3e = local_1082;
        local_1083 = local_dd8._4_4_ == iStack_d50 && local_f10[4] == 4;
        local_f3f = local_1083;
        local_1084 = local_df8._4_4_ == iStack_d00 + 1 && local_f10[1] == 4;
        local_f40 = local_1084;
        local_1085 = local_dd8._4_4_ == iStack_d50 && local_f10[4] == 2;
        local_f41 = local_1085;
        bVar2 = local_df8._4_4_ == iStack_d00 + 1;
        local_1086 = bVar2 && local_f10[1] == 2;
        local_f42 = local_1086;
        if (((local_1081) || (local_1083)) || (local_dd8._4_4_ == iStack_d50 && local_f10[4] == 2))
        {
          local_f48 = local_dd8._4_4_ + 1;
        }
        else {
          local_f48 = local_dd8._4_4_;
        }
        if (((local_1082) || (local_1084)) || (bVar2 && local_f10[1] == 2)) {
          local_f4c = local_df8._4_4_ + -1;
        }
        else {
          local_f4c = local_df8._4_4_;
        }
        if (local_dcc == low) {
          for (local_f50 = local_f48; local_f50 <= local_f4c; local_f50 = local_f50 + 1) {
            local_f58 = 0.0;
            local_f5c = local_df0;
            while (local_f5c = local_f5c + -1, local_dd0 <= local_f5c) {
              local_2a8 = local_e58;
              local_2ac = local_f3c;
              local_2b0 = local_f50;
              local_2b4 = local_f5c;
              local_2c8 = local_f50 + -1;
              local_2c0 = local_e58;
              local_2c4 = local_f3c;
              local_2cc = local_f5c;
              local_f30 = (local_e58->p
                           [(long)(local_f3c - (local_e58->begin).x) +
                            (long)(local_f50 - (local_e58->begin).y) * local_e58->jstride +
                            (long)(local_f5c - (local_e58->begin).z) * local_e58->kstride] +
                          local_e58->p
                          [(long)(local_f3c - (local_e58->begin).x) +
                           (long)(local_2c8 - (local_e58->begin).y) * local_e58->jstride +
                           (long)(local_f5c - (local_e58->begin).z) * local_e58->kstride]) * 0.5;
              local_2dc = local_f3c + 1;
              local_2d8 = local_e58;
              local_2e0 = local_f50;
              local_2e4 = local_f5c;
              local_2f4 = local_f3c + 1;
              local_2f8 = local_f50 + -1;
              local_2f0 = local_e58;
              local_2fc = local_f5c;
              local_f38 = (local_e58->p
                           [(long)(local_2dc - (local_e58->begin).x) +
                            (long)(local_f50 - (local_e58->begin).y) * local_e58->jstride +
                            (long)(local_f5c - (local_e58->begin).z) * local_e58->kstride] +
                          local_e58->p
                          [(long)(local_2f4 - (local_e58->begin).x) +
                           (long)(local_2f8 - (local_e58->begin).y) * local_e58->jstride +
                           (long)(local_f5c - (local_e58->begin).z) * local_e58->kstride]) * 0.5;
              local_308 = local_e10;
              local_30c = local_f3c;
              local_310 = local_f50;
              local_314 = local_f5c;
              computeRhoG::anon_class_16_2_2e1508ad::operator()
                        (&local_eb0,local_f30,local_f38,&local_f58,
                         local_e10->p +
                         (long)(local_f3c - (local_e10->begin).x) +
                         (long)(local_f50 - (local_e10->begin).y) * local_e10->jstride +
                         (long)(local_f5c - (local_e10->begin).z) * local_e10->kstride);
            }
          }
          if ((((local_f3d & 1U) != 0) || ((local_f3f & 1U) != 0)) || ((local_f41 & 1U) != 0)) {
            local_f60 = local_dd8._4_4_;
            local_f68 = 0.0;
            iVar1 = local_df0;
            if ((local_f3d & 1U) == 0) {
              if ((local_f3f & 1U) == 0) {
                if ((local_f41 & 1U) != 0) {
                  while (local_f74 = iVar1 + -1, local_dd0 <= local_f74) {
                    local_3e0 = local_e58;
                    local_3e4 = local_f3c;
                    local_3e8 = local_f60;
                    local_3ec = local_f74;
                    local_f30 = local_e58->p
                                [(long)(local_f3c - (local_e58->begin).x) +
                                 (long)(local_f60 - (local_e58->begin).y) * local_e58->jstride +
                                 (long)(local_f74 - (local_e58->begin).z) * local_e58->kstride];
                    local_3fc = local_f3c + 1;
                    local_3f8 = local_e58;
                    local_400 = local_f60;
                    local_404 = local_f74;
                    local_f38 = local_e58->p
                                [(long)(local_3fc - (local_e58->begin).x) +
                                 (long)(local_f60 - (local_e58->begin).y) * local_e58->jstride +
                                 (long)(local_f74 - (local_e58->begin).z) * local_e58->kstride];
                    local_410 = local_e10;
                    local_414 = local_f3c;
                    local_418 = local_f60;
                    local_41c = local_f74;
                    computeRhoG::anon_class_16_2_2e1508ad::operator()
                              (&local_eb0,local_f30,local_f38,&local_f68,
                               local_e10->p +
                               (long)(local_f3c - (local_e10->begin).x) +
                               (long)(local_f60 - (local_e10->begin).y) * local_e10->jstride +
                               (long)(local_f74 - (local_e10->begin).z) * local_e10->kstride);
                    iVar1 = local_f74;
                  }
                }
              }
              else {
                while (local_f70 = iVar1 + -1, local_dd0 <= local_f70) {
                  local_368 = local_e58;
                  local_36c = local_f3c;
                  local_370 = local_f60;
                  local_374 = local_f70;
                  local_388 = local_f60 + 1;
                  local_380 = local_e58;
                  local_384 = local_f3c;
                  local_38c = local_f70;
                  local_f30 = (local_e58->p
                               [(long)(local_f3c - (local_e58->begin).x) +
                                (long)(local_f60 - (local_e58->begin).y) * local_e58->jstride +
                                (long)(local_f70 - (local_e58->begin).z) * local_e58->kstride] * 3.0
                              + -local_e58->p
                                 [(long)(local_f3c - (local_e58->begin).x) +
                                  (long)(local_388 - (local_e58->begin).y) * local_e58->jstride +
                                  (long)(local_f70 - (local_e58->begin).z) * local_e58->kstride]) *
                              0.5;
                  local_39c = local_f3c + 1;
                  local_398 = local_e58;
                  local_3a0 = local_f60;
                  local_3a4 = local_f70;
                  local_3b4 = local_f3c + 1;
                  local_3b8 = local_f60 + 1;
                  local_3b0 = local_e58;
                  local_3bc = local_f70;
                  local_f38 = (local_e58->p
                               [(long)(local_39c - (local_e58->begin).x) +
                                (long)(local_f60 - (local_e58->begin).y) * local_e58->jstride +
                                (long)(local_f70 - (local_e58->begin).z) * local_e58->kstride] * 3.0
                              + -local_e58->p
                                 [(long)(local_3b4 - (local_e58->begin).x) +
                                  (long)(local_3b8 - (local_e58->begin).y) * local_e58->jstride +
                                  (long)(local_f70 - (local_e58->begin).z) * local_e58->kstride]) *
                              0.5;
                  local_3c8 = local_e10;
                  local_3cc = local_f3c;
                  local_3d0 = local_f60;
                  local_3d4 = local_f70;
                  computeRhoG::anon_class_16_2_2e1508ad::operator()
                            (&local_eb0,local_f30,local_f38,&local_f68,
                             local_e10->p +
                             (long)(local_f3c - (local_e10->begin).x) +
                             (long)(local_f60 - (local_e10->begin).y) * local_e10->jstride +
                             (long)(local_f70 - (local_e10->begin).z) * local_e10->kstride);
                  iVar1 = local_f70;
                }
              }
            }
            else {
              while (local_f6c = iVar1 + -1, local_dd0 <= local_f6c) {
                local_328 = local_f60 + -1;
                local_320 = local_e58;
                local_324 = local_f3c;
                local_32c = local_f6c;
                local_f30 = local_e58->p
                            [(long)(local_f3c - (local_e58->begin).x) +
                             (long)(local_328 - (local_e58->begin).y) * local_e58->jstride +
                             (long)(local_f6c - (local_e58->begin).z) * local_e58->kstride];
                local_33c = local_f3c + 1;
                local_340 = local_f60 + -1;
                local_338 = local_e58;
                local_344 = local_f6c;
                local_f38 = local_e58->p
                            [(long)(local_33c - (local_e58->begin).x) +
                             (long)(local_340 - (local_e58->begin).y) * local_e58->jstride +
                             (long)(local_f6c - (local_e58->begin).z) * local_e58->kstride];
                local_350 = local_e10;
                local_354 = local_f3c;
                local_358 = local_f60;
                local_35c = local_f6c;
                computeRhoG::anon_class_16_2_2e1508ad::operator()
                          (&local_eb0,local_f30,local_f38,&local_f68,
                           local_e10->p +
                           (long)(local_f3c - (local_e10->begin).x) +
                           (long)(local_f60 - (local_e10->begin).y) * local_e10->jstride +
                           (long)(local_f6c - (local_e10->begin).z) * local_e10->kstride);
                iVar1 = local_f6c;
              }
            }
          }
          if ((((local_f3e & 1U) != 0) || ((local_f40 & 1U) != 0)) || ((local_f42 & 1U) != 0)) {
            local_f78 = local_df8._4_4_;
            local_f80 = 0.0;
            iVar1 = local_df0;
            if ((local_f3e & 1U) == 0) {
              if ((local_f40 & 1U) == 0) {
                if ((local_f42 & 1U) != 0) {
                  while (local_f8c = iVar1 + -1, local_dd0 <= local_f8c) {
                    local_4f0 = local_f78 + -1;
                    local_4e8 = local_e58;
                    local_4ec = local_f3c;
                    local_4f4 = local_f8c;
                    local_f30 = local_e58->p
                                [(long)(local_f3c - (local_e58->begin).x) +
                                 (long)(local_4f0 - (local_e58->begin).y) * local_e58->jstride +
                                 (long)(local_f8c - (local_e58->begin).z) * local_e58->kstride];
                    local_504 = local_f3c + 1;
                    local_508 = local_f78 + -1;
                    local_500 = local_e58;
                    local_50c = local_f8c;
                    local_f38 = local_e58->p
                                [(long)(local_504 - (local_e58->begin).x) +
                                 (long)(local_508 - (local_e58->begin).y) * local_e58->jstride +
                                 (long)(local_f8c - (local_e58->begin).z) * local_e58->kstride];
                    local_518 = local_e10;
                    local_51c = local_f3c;
                    local_520 = local_f78;
                    local_524 = local_f8c;
                    computeRhoG::anon_class_16_2_2e1508ad::operator()
                              (&local_eb0,local_f30,local_f38,&local_f80,
                               local_e10->p +
                               (long)(local_f3c - (local_e10->begin).x) +
                               (long)(local_f78 - (local_e10->begin).y) * local_e10->jstride +
                               (long)(local_f8c - (local_e10->begin).z) * local_e10->kstride);
                    iVar1 = local_f8c;
                  }
                }
              }
              else {
                while (local_f88 = iVar1 + -1, local_dd0 <= local_f88) {
                  local_478 = local_f78 + -1;
                  local_470 = local_e58;
                  local_474 = local_f3c;
                  local_47c = local_f88;
                  local_490 = local_f78 + -2;
                  local_488 = local_e58;
                  local_48c = local_f3c;
                  local_494 = local_f88;
                  local_f30 = (local_e58->p
                               [(long)(local_f3c - (local_e58->begin).x) +
                                (long)(local_478 - (local_e58->begin).y) * local_e58->jstride +
                                (long)(local_f88 - (local_e58->begin).z) * local_e58->kstride] * 3.0
                              + -local_e58->p
                                 [(long)(local_f3c - (local_e58->begin).x) +
                                  (long)(local_490 - (local_e58->begin).y) * local_e58->jstride +
                                  (long)(local_f88 - (local_e58->begin).z) * local_e58->kstride]) *
                              0.5;
                  local_4a4 = local_f3c + 1;
                  local_4a8 = local_f78 + -1;
                  local_4a0 = local_e58;
                  local_4ac = local_f88;
                  local_4bc = local_f3c + 1;
                  local_4c0 = local_f78 + -2;
                  local_4b8 = local_e58;
                  local_4c4 = local_f88;
                  local_f38 = (local_e58->p
                               [(long)(local_4a4 - (local_e58->begin).x) +
                                (long)(local_4a8 - (local_e58->begin).y) * local_e58->jstride +
                                (long)(local_f88 - (local_e58->begin).z) * local_e58->kstride] * 3.0
                              + -local_e58->p
                                 [(long)(local_4bc - (local_e58->begin).x) +
                                  (long)(local_4c0 - (local_e58->begin).y) * local_e58->jstride +
                                  (long)(local_f88 - (local_e58->begin).z) * local_e58->kstride]) *
                              0.5;
                  local_4d0 = local_e10;
                  local_4d4 = local_f3c;
                  local_4d8 = local_f78;
                  local_4dc = local_f88;
                  computeRhoG::anon_class_16_2_2e1508ad::operator()
                            (&local_eb0,local_f30,local_f38,&local_f80,
                             local_e10->p +
                             (long)(local_f3c - (local_e10->begin).x) +
                             (long)(local_f78 - (local_e10->begin).y) * local_e10->jstride +
                             (long)(local_f88 - (local_e10->begin).z) * local_e10->kstride);
                  iVar1 = local_f88;
                }
              }
            }
            else {
              while (local_f84 = iVar1 + -1, local_dd0 <= local_f84) {
                local_428 = local_e58;
                local_42c = local_f3c;
                local_430 = local_f78;
                local_434 = local_f84;
                local_f30 = local_e58->p
                            [(long)(local_f3c - (local_e58->begin).x) +
                             (long)(local_f78 - (local_e58->begin).y) * local_e58->jstride +
                             (long)(local_f84 - (local_e58->begin).z) * local_e58->kstride];
                local_444 = local_f3c + 1;
                local_440 = local_e58;
                local_448 = local_f78;
                local_44c = local_f84;
                local_f38 = local_e58->p
                            [(long)(local_444 - (local_e58->begin).x) +
                             (long)(local_f78 - (local_e58->begin).y) * local_e58->jstride +
                             (long)(local_f84 - (local_e58->begin).z) * local_e58->kstride];
                local_458 = local_e10;
                local_45c = local_f3c;
                local_460 = local_f78;
                local_464 = local_f84;
                computeRhoG::anon_class_16_2_2e1508ad::operator()
                          (&local_eb0,local_f30,local_f38,&local_f80,
                           local_e10->p +
                           (long)(local_f3c - (local_e10->begin).x) +
                           (long)(local_f78 - (local_e10->begin).y) * local_e10->jstride +
                           (long)(local_f84 - (local_e10->begin).z) * local_e10->kstride);
                iVar1 = local_f84;
              }
            }
          }
        }
        else {
          for (local_f90 = local_f48; local_f90 <= local_f4c; local_f90 = local_f90 + 1) {
            local_f98 = 0.0;
            local_f9c = local_df0;
            while (local_f9c = local_f9c + -1, local_dd0 <= local_f9c) {
              local_534 = local_f3c + -1;
              local_530 = local_e58;
              local_538 = local_f90;
              local_53c = local_f9c;
              local_54c = local_f3c + -1;
              local_550 = local_f90 + -1;
              local_548 = local_e58;
              local_554 = local_f9c;
              local_f30 = (local_e58->p
                           [(long)(local_534 - (local_e58->begin).x) +
                            (long)(local_f90 - (local_e58->begin).y) * local_e58->jstride +
                            (long)(local_f9c - (local_e58->begin).z) * local_e58->kstride] +
                          local_e58->p
                          [(long)(local_54c - (local_e58->begin).x) +
                           (long)(local_550 - (local_e58->begin).y) * local_e58->jstride +
                           (long)(local_f9c - (local_e58->begin).z) * local_e58->kstride]) * 0.5;
              local_564 = local_f3c + -2;
              local_560 = local_e58;
              local_568 = local_f90;
              local_56c = local_f9c;
              local_57c = local_f3c + -2;
              local_580 = local_f90 + -1;
              local_578 = local_e58;
              local_584 = local_f9c;
              local_f38 = (local_e58->p
                           [(long)(local_564 - (local_e58->begin).x) +
                            (long)(local_f90 - (local_e58->begin).y) * local_e58->jstride +
                            (long)(local_f9c - (local_e58->begin).z) * local_e58->kstride] +
                          local_e58->p
                          [(long)(local_57c - (local_e58->begin).x) +
                           (long)(local_580 - (local_e58->begin).y) * local_e58->jstride +
                           (long)(local_f9c - (local_e58->begin).z) * local_e58->kstride]) * 0.5;
              local_590 = local_e10;
              local_594 = local_f3c;
              local_598 = local_f90;
              local_59c = local_f9c;
              computeRhoG::anon_class_16_2_2e1508ad::operator()
                        (&local_eb0,local_f30,local_f38,&local_f98,
                         local_e10->p +
                         (long)(local_f3c - (local_e10->begin).x) +
                         (long)(local_f90 - (local_e10->begin).y) * local_e10->jstride +
                         (long)(local_f9c - (local_e10->begin).z) * local_e10->kstride);
            }
          }
          if ((((local_f3d & 1U) != 0) || ((local_f3f & 1U) != 0)) || ((local_f41 & 1U) != 0)) {
            local_fa0 = local_dd8._4_4_;
            local_fa8 = 0.0;
            iVar1 = local_df0;
            if ((local_f3d & 1U) == 0) {
              if ((local_f3f & 1U) == 0) {
                if ((local_f41 & 1U) != 0) {
                  while (local_fb4 = iVar1 + -1, local_dd0 <= local_fb4) {
                    local_66c = local_f3c + -1;
                    local_668 = local_e58;
                    local_670 = local_fa0;
                    local_674 = local_fb4;
                    local_f30 = local_e58->p
                                [(long)(local_66c - (local_e58->begin).x) +
                                 (long)(local_fa0 - (local_e58->begin).y) * local_e58->jstride +
                                 (long)(local_fb4 - (local_e58->begin).z) * local_e58->kstride];
                    local_684 = local_f3c + -2;
                    local_680 = local_e58;
                    local_688 = local_fa0;
                    local_68c = local_fb4;
                    local_f38 = local_e58->p
                                [(long)(local_684 - (local_e58->begin).x) +
                                 (long)(local_fa0 - (local_e58->begin).y) * local_e58->jstride +
                                 (long)(local_fb4 - (local_e58->begin).z) * local_e58->kstride];
                    local_698 = local_e10;
                    local_69c = local_f3c;
                    local_6a0 = local_fa0;
                    local_6a4 = local_fb4;
                    computeRhoG::anon_class_16_2_2e1508ad::operator()
                              (&local_eb0,local_f30,local_f38,&local_fa8,
                               local_e10->p +
                               (long)(local_f3c - (local_e10->begin).x) +
                               (long)(local_fa0 - (local_e10->begin).y) * local_e10->jstride +
                               (long)(local_fb4 - (local_e10->begin).z) * local_e10->kstride);
                    iVar1 = local_fb4;
                  }
                }
              }
              else {
                while (local_fb0 = iVar1 + -1, local_dd0 <= local_fb0) {
                  local_5f4 = local_f3c + -1;
                  local_5f0 = local_e58;
                  local_5f8 = local_fa0;
                  local_5fc = local_fb0;
                  local_60c = local_f3c + -1;
                  local_610 = local_fa0 + 1;
                  local_608 = local_e58;
                  local_614 = local_fb0;
                  local_f30 = (local_e58->p
                               [(long)(local_5f4 - (local_e58->begin).x) +
                                (long)(local_fa0 - (local_e58->begin).y) * local_e58->jstride +
                                (long)(local_fb0 - (local_e58->begin).z) * local_e58->kstride] * 3.0
                              + -local_e58->p
                                 [(long)(local_60c - (local_e58->begin).x) +
                                  (long)(local_610 - (local_e58->begin).y) * local_e58->jstride +
                                  (long)(local_fb0 - (local_e58->begin).z) * local_e58->kstride]) *
                              0.5;
                  local_624 = local_f3c + -2;
                  local_620 = local_e58;
                  local_628 = local_fa0;
                  local_62c = local_fb0;
                  local_63c = local_f3c + -2;
                  local_640 = local_fa0 + 1;
                  local_638 = local_e58;
                  local_644 = local_fb0;
                  local_f38 = (local_e58->p
                               [(long)(local_624 - (local_e58->begin).x) +
                                (long)(local_fa0 - (local_e58->begin).y) * local_e58->jstride +
                                (long)(local_fb0 - (local_e58->begin).z) * local_e58->kstride] * 3.0
                              + -local_e58->p
                                 [(long)(local_63c - (local_e58->begin).x) +
                                  (long)(local_640 - (local_e58->begin).y) * local_e58->jstride +
                                  (long)(local_fb0 - (local_e58->begin).z) * local_e58->kstride]) *
                              0.5;
                  local_650 = local_e10;
                  local_654 = local_f3c;
                  local_658 = local_fa0;
                  local_65c = local_fb0;
                  computeRhoG::anon_class_16_2_2e1508ad::operator()
                            (&local_eb0,local_f30,local_f38,&local_fa8,
                             local_e10->p +
                             (long)(local_f3c - (local_e10->begin).x) +
                             (long)(local_fa0 - (local_e10->begin).y) * local_e10->jstride +
                             (long)(local_fb0 - (local_e10->begin).z) * local_e10->kstride);
                  iVar1 = local_fb0;
                }
              }
            }
            else {
              while (local_fac = iVar1 + -1, local_dd0 <= local_fac) {
                local_5ac = local_f3c + -1;
                local_5b0 = local_fa0 + -1;
                local_5a8 = local_e58;
                local_5b4 = local_fac;
                local_f30 = local_e58->p
                            [(long)(local_5ac - (local_e58->begin).x) +
                             (long)(local_5b0 - (local_e58->begin).y) * local_e58->jstride +
                             (long)(local_fac - (local_e58->begin).z) * local_e58->kstride];
                local_5c4 = local_f3c + -2;
                local_5c8 = local_fa0 + -1;
                local_5c0 = local_e58;
                local_5cc = local_fac;
                local_f38 = local_e58->p
                            [(long)(local_5c4 - (local_e58->begin).x) +
                             (long)(local_5c8 - (local_e58->begin).y) * local_e58->jstride +
                             (long)(local_fac - (local_e58->begin).z) * local_e58->kstride];
                local_5d8 = local_e10;
                local_5dc = local_f3c;
                local_5e0 = local_fa0;
                local_5e4 = local_fac;
                computeRhoG::anon_class_16_2_2e1508ad::operator()
                          (&local_eb0,local_f30,local_f38,&local_fa8,
                           local_e10->p +
                           (long)(local_f3c - (local_e10->begin).x) +
                           (long)(local_fa0 - (local_e10->begin).y) * local_e10->jstride +
                           (long)(local_fac - (local_e10->begin).z) * local_e10->kstride);
                iVar1 = local_fac;
              }
            }
          }
          if ((((local_f3e & 1U) != 0) || ((local_f40 & 1U) != 0)) || ((local_f42 & 1U) != 0)) {
            local_fb8 = local_df8._4_4_;
            local_fc0 = 0.0;
            iVar1 = local_df0;
            if ((local_f3e & 1U) == 0) {
              if ((local_f40 & 1U) == 0) {
                if ((local_f42 & 1U) != 0) {
                  while (local_fcc = iVar1 + -1, local_dd0 <= local_fcc) {
                    local_774 = local_f3c + -1;
                    local_778 = local_fb8 + -1;
                    local_770 = local_e58;
                    local_77c = local_fcc;
                    local_f30 = local_e58->p
                                [(long)(local_774 - (local_e58->begin).x) +
                                 (long)(local_778 - (local_e58->begin).y) * local_e58->jstride +
                                 (long)(local_fcc - (local_e58->begin).z) * local_e58->kstride];
                    local_78c = local_f3c + -2;
                    local_790 = local_fb8 + -1;
                    local_788 = local_e58;
                    local_794 = local_fcc;
                    local_f38 = local_e58->p
                                [(long)(local_78c - (local_e58->begin).x) +
                                 (long)(local_790 - (local_e58->begin).y) * local_e58->jstride +
                                 (long)(local_fcc - (local_e58->begin).z) * local_e58->kstride];
                    local_7a0 = local_e10;
                    local_7a4 = local_f3c;
                    local_7a8 = local_fb8;
                    local_7ac = local_fcc;
                    computeRhoG::anon_class_16_2_2e1508ad::operator()
                              (&local_eb0,local_f30,local_f38,&local_fc0,
                               local_e10->p +
                               (long)(local_f3c - (local_e10->begin).x) +
                               (long)(local_fb8 - (local_e10->begin).y) * local_e10->jstride +
                               (long)(local_fcc - (local_e10->begin).z) * local_e10->kstride);
                    iVar1 = local_fcc;
                  }
                }
              }
              else {
                while (local_fc8 = iVar1 + -1, local_dd0 <= local_fc8) {
                  local_6fc = local_f3c + -1;
                  local_700 = local_fb8 + -1;
                  local_6f8 = local_e58;
                  local_704 = local_fc8;
                  local_714 = local_f3c + -1;
                  local_718 = local_fb8 + -2;
                  local_710 = local_e58;
                  local_71c = local_fc8;
                  local_f30 = (local_e58->p
                               [(long)(local_6fc - (local_e58->begin).x) +
                                (long)(local_700 - (local_e58->begin).y) * local_e58->jstride +
                                (long)(local_fc8 - (local_e58->begin).z) * local_e58->kstride] * 3.0
                              + -local_e58->p
                                 [(long)(local_714 - (local_e58->begin).x) +
                                  (long)(local_718 - (local_e58->begin).y) * local_e58->jstride +
                                  (long)(local_fc8 - (local_e58->begin).z) * local_e58->kstride]) *
                              0.5;
                  local_72c = local_f3c + -2;
                  local_730 = local_fb8 + -1;
                  local_728 = local_e58;
                  local_734 = local_fc8;
                  local_744 = local_f3c + -2;
                  local_748 = local_fb8 + -2;
                  local_740 = local_e58;
                  local_74c = local_fc8;
                  local_f38 = (local_e58->p
                               [(long)(local_72c - (local_e58->begin).x) +
                                (long)(local_730 - (local_e58->begin).y) * local_e58->jstride +
                                (long)(local_fc8 - (local_e58->begin).z) * local_e58->kstride] * 3.0
                              + -local_e58->p
                                 [(long)(local_744 - (local_e58->begin).x) +
                                  (long)(local_748 - (local_e58->begin).y) * local_e58->jstride +
                                  (long)(local_fc8 - (local_e58->begin).z) * local_e58->kstride]) *
                              0.5;
                  local_758 = local_e10;
                  local_75c = local_f3c;
                  local_760 = local_fb8;
                  local_764 = local_fc8;
                  computeRhoG::anon_class_16_2_2e1508ad::operator()
                            (&local_eb0,local_f30,local_f38,&local_fc0,
                             local_e10->p +
                             (long)(local_f3c - (local_e10->begin).x) +
                             (long)(local_fb8 - (local_e10->begin).y) * local_e10->jstride +
                             (long)(local_fc8 - (local_e10->begin).z) * local_e10->kstride);
                  iVar1 = local_fc8;
                }
              }
            }
            else {
              while (local_fc4 = iVar1 + -1, local_dd0 <= local_fc4) {
                local_6b4 = local_f3c + -1;
                local_6b0 = local_e58;
                local_6b8 = local_fb8;
                local_6bc = local_fc4;
                local_f30 = local_e58->p
                            [(long)(local_6b4 - (local_e58->begin).x) +
                             (long)(local_fb8 - (local_e58->begin).y) * local_e58->jstride +
                             (long)(local_fc4 - (local_e58->begin).z) * local_e58->kstride];
                local_6cc = local_f3c + -2;
                local_6c8 = local_e58;
                local_6d0 = local_fb8;
                local_6d4 = local_fc4;
                local_f38 = local_e58->p
                            [(long)(local_6cc - (local_e58->begin).x) +
                             (long)(local_fb8 - (local_e58->begin).y) * local_e58->jstride +
                             (long)(local_fc4 - (local_e58->begin).z) * local_e58->kstride];
                local_6e0 = local_e10;
                local_6e4 = local_f3c;
                local_6e8 = local_fb8;
                local_6ec = local_fc4;
                computeRhoG::anon_class_16_2_2e1508ad::operator()
                          (&local_eb0,local_f30,local_f38,&local_fc0,
                           local_e10->p +
                           (long)(local_f3c - (local_e10->begin).x) +
                           (long)(local_fb8 - (local_e10->begin).y) * local_e10->jstride +
                           (long)(local_fc4 - (local_e10->begin).z) * local_e10->kstride);
                iVar1 = local_fc4;
              }
            }
          }
        }
      }
      else {
        local_fd0 = local_dd8._4_4_;
        local_1087 = (int)local_dd8 == local_d54 && local_f10[3] == 3;
        local_fd1 = local_1087;
        local_1088 = (int)local_df8 == local_d04 + 1 && local_f10[0] == 3;
        local_fd2 = local_1088;
        local_1089 = (int)local_dd8 == local_d54 && local_f10[3] == 4;
        local_fd3 = local_1089;
        local_108a = (int)local_df8 == local_d04 + 1 && local_f10[0] == 4;
        local_fd4 = local_108a;
        local_108b = (int)local_dd8 == local_d54 && local_f10[3] == 2;
        local_fd5 = local_108b;
        bVar2 = (int)local_df8 == local_d04 + 1;
        local_108c = bVar2 && local_f10[0] == 2;
        local_fd6 = local_108c;
        if (((local_1087) || (local_1089)) || ((int)local_dd8 == local_d54 && local_f10[3] == 2)) {
          local_fdc = (int)local_dd8 + 1;
        }
        else {
          local_fdc = (int)local_dd8;
        }
        if (((local_1088) || (local_108a)) || (bVar2 && local_f10[0] == 2)) {
          local_fe0 = (int)local_df8 + -1;
        }
        else {
          local_fe0 = (int)local_df8;
        }
        if (local_dcc == low) {
          for (local_fe4 = local_fdc; local_fe4 <= local_fe0; local_fe4 = local_fe4 + 1) {
            local_ff0 = 0.0;
            local_ff4 = local_df0;
            while (local_ff4 = local_ff4 + -1, local_dd0 <= local_ff4) {
              local_7b8 = local_e58;
              local_7bc = local_fe4;
              local_7c0 = local_fd0;
              local_7c4 = local_ff4;
              local_7d4 = local_fe4 + -1;
              local_7d0 = local_e58;
              local_7d8 = local_fd0;
              local_7dc = local_ff4;
              local_f30 = (local_e58->p
                           [(long)(local_fe4 - (local_e58->begin).x) +
                            (long)(local_fd0 - (local_e58->begin).y) * local_e58->jstride +
                            (long)(local_ff4 - (local_e58->begin).z) * local_e58->kstride] +
                          local_e58->p
                          [(long)(local_7d4 - (local_e58->begin).x) +
                           (long)(local_fd0 - (local_e58->begin).y) * local_e58->jstride +
                           (long)(local_ff4 - (local_e58->begin).z) * local_e58->kstride]) * 0.5;
              local_7f0 = local_fd0 + 1;
              local_7e8 = local_e58;
              local_7ec = local_fe4;
              local_7f4 = local_ff4;
              local_804 = local_fe4 + -1;
              local_808 = local_fd0 + 1;
              local_800 = local_e58;
              local_80c = local_ff4;
              local_f38 = (local_e58->p
                           [(long)(local_fe4 - (local_e58->begin).x) +
                            (long)(local_7f0 - (local_e58->begin).y) * local_e58->jstride +
                            (long)(local_ff4 - (local_e58->begin).z) * local_e58->kstride] +
                          local_e58->p
                          [(long)(local_804 - (local_e58->begin).x) +
                           (long)(local_808 - (local_e58->begin).y) * local_e58->jstride +
                           (long)(local_ff4 - (local_e58->begin).z) * local_e58->kstride]) * 0.5;
              local_818 = local_e10;
              local_81c = local_fe4;
              local_820 = local_fd0;
              local_824 = local_ff4;
              computeRhoG::anon_class_16_2_2e1508ad::operator()
                        (&local_eb0,local_f30,local_f38,&local_ff0,
                         local_e10->p +
                         (long)(local_fe4 - (local_e10->begin).x) +
                         (long)(local_fd0 - (local_e10->begin).y) * local_e10->jstride +
                         (long)(local_ff4 - (local_e10->begin).z) * local_e10->kstride);
            }
          }
          if ((((local_fd1 & 1U) != 0) || ((local_fd3 & 1U) != 0)) || ((local_fd5 & 1U) != 0)) {
            local_ff8 = (int)local_dd8;
            local_1000 = 0.0;
            iVar1 = local_df0;
            if ((local_fd1 & 1U) == 0) {
              if ((local_fd3 & 1U) == 0) {
                if ((local_fd5 & 1U) != 0) {
                  while (local_100c = iVar1 + -1, local_dd0 <= local_100c) {
                    local_8f0 = local_e58;
                    local_8f4 = local_ff8;
                    local_8f8 = local_fd0;
                    local_8fc = local_100c;
                    local_f30 = local_e58->p
                                [(long)(local_ff8 - (local_e58->begin).x) +
                                 (long)(local_fd0 - (local_e58->begin).y) * local_e58->jstride +
                                 (long)(local_100c - (local_e58->begin).z) * local_e58->kstride];
                    local_910 = local_fd0 + 1;
                    local_908 = local_e58;
                    local_90c = local_ff8;
                    local_914 = local_100c;
                    local_f38 = local_e58->p
                                [(long)(local_ff8 - (local_e58->begin).x) +
                                 (long)(local_910 - (local_e58->begin).y) * local_e58->jstride +
                                 (long)(local_100c - (local_e58->begin).z) * local_e58->kstride];
                    local_920 = local_e10;
                    local_924 = local_ff8;
                    local_928 = local_fd0;
                    local_92c = local_100c;
                    computeRhoG::anon_class_16_2_2e1508ad::operator()
                              (&local_eb0,local_f30,local_f38,&local_1000,
                               local_e10->p +
                               (long)(local_ff8 - (local_e10->begin).x) +
                               (long)(local_fd0 - (local_e10->begin).y) * local_e10->jstride +
                               (long)(local_100c - (local_e10->begin).z) * local_e10->kstride);
                    iVar1 = local_100c;
                  }
                }
              }
              else {
                while (local_1008 = iVar1 + -1, local_dd0 <= local_1008) {
                  local_878 = local_e58;
                  local_87c = local_ff8;
                  local_880 = local_fd0;
                  local_884 = local_1008;
                  local_894 = local_ff8 + 1;
                  local_890 = local_e58;
                  local_898 = local_fd0;
                  local_89c = local_1008;
                  local_f30 = (local_e58->p
                               [(long)(local_ff8 - (local_e58->begin).x) +
                                (long)(local_fd0 - (local_e58->begin).y) * local_e58->jstride +
                                (long)(local_1008 - (local_e58->begin).z) * local_e58->kstride] *
                               3.0 + -local_e58->p
                                      [(long)(local_894 - (local_e58->begin).x) +
                                       (long)(local_fd0 - (local_e58->begin).y) * local_e58->jstride
                                       + (long)(local_1008 - (local_e58->begin).z) *
                                         local_e58->kstride]) * 0.5;
                  local_8b0 = local_fd0 + 1;
                  local_8a8 = local_e58;
                  local_8ac = local_ff8;
                  local_8b4 = local_1008;
                  local_8c4 = local_ff8 + 1;
                  local_8c8 = local_fd0 + 1;
                  local_8c0 = local_e58;
                  local_8cc = local_1008;
                  local_f38 = (local_e58->p
                               [(long)(local_ff8 - (local_e58->begin).x) +
                                (long)(local_8b0 - (local_e58->begin).y) * local_e58->jstride +
                                (long)(local_1008 - (local_e58->begin).z) * local_e58->kstride] *
                               3.0 + -local_e58->p
                                      [(long)(local_8c4 - (local_e58->begin).x) +
                                       (long)(local_8c8 - (local_e58->begin).y) * local_e58->jstride
                                       + (long)(local_1008 - (local_e58->begin).z) *
                                         local_e58->kstride]) * 0.5;
                  local_8d8 = local_e10;
                  local_8dc = local_ff8;
                  local_8e0 = local_fd0;
                  local_8e4 = local_1008;
                  computeRhoG::anon_class_16_2_2e1508ad::operator()
                            (&local_eb0,local_f30,local_f38,&local_1000,
                             local_e10->p +
                             (long)(local_ff8 - (local_e10->begin).x) +
                             (long)(local_fd0 - (local_e10->begin).y) * local_e10->jstride +
                             (long)(local_1008 - (local_e10->begin).z) * local_e10->kstride);
                  iVar1 = local_1008;
                }
              }
            }
            else {
              while (local_1004 = iVar1 + -1, local_dd0 <= local_1004) {
                local_834 = local_ff8 + -1;
                local_830 = local_e58;
                local_838 = local_fd0;
                local_83c = local_1004;
                local_f30 = local_e58->p
                            [(long)(local_834 - (local_e58->begin).x) +
                             (long)(local_fd0 - (local_e58->begin).y) * local_e58->jstride +
                             (long)(local_1004 - (local_e58->begin).z) * local_e58->kstride];
                local_84c = local_ff8 + -1;
                local_850 = local_fd0 + 1;
                local_848 = local_e58;
                local_854 = local_1004;
                local_f38 = local_e58->p
                            [(long)(local_84c - (local_e58->begin).x) +
                             (long)(local_850 - (local_e58->begin).y) * local_e58->jstride +
                             (long)(local_1004 - (local_e58->begin).z) * local_e58->kstride];
                local_860 = local_e10;
                local_864 = local_ff8;
                local_868 = local_fd0;
                local_86c = local_1004;
                computeRhoG::anon_class_16_2_2e1508ad::operator()
                          (&local_eb0,local_f30,local_f38,&local_1000,
                           local_e10->p +
                           (long)(local_ff8 - (local_e10->begin).x) +
                           (long)(local_fd0 - (local_e10->begin).y) * local_e10->jstride +
                           (long)(local_1004 - (local_e10->begin).z) * local_e10->kstride);
                iVar1 = local_1004;
              }
            }
          }
          if ((((local_fd2 & 1U) != 0) || ((local_fd4 & 1U) != 0)) || ((local_fd6 & 1U) != 0)) {
            local_1010 = (int)local_df8;
            local_1018 = 0.0;
            iVar1 = local_df0;
            if ((local_fd2 & 1U) == 0) {
              if ((local_fd4 & 1U) == 0) {
                if ((local_fd6 & 1U) != 0) {
                  while (local_1024 = iVar1 + -1, local_dd0 <= local_1024) {
                    local_9fc = local_1010 + -1;
                    local_9f8 = local_e58;
                    local_a00 = local_fd0;
                    local_a04 = local_1024;
                    local_f30 = local_e58->p
                                [(long)(local_9fc - (local_e58->begin).x) +
                                 (long)(local_fd0 - (local_e58->begin).y) * local_e58->jstride +
                                 (long)(local_1024 - (local_e58->begin).z) * local_e58->kstride];
                    local_a14 = local_1010 + -1;
                    local_a18 = local_fd0 + 1;
                    local_a10 = local_e58;
                    local_a1c = local_1024;
                    local_f38 = local_e58->p
                                [(long)(local_a14 - (local_e58->begin).x) +
                                 (long)(local_a18 - (local_e58->begin).y) * local_e58->jstride +
                                 (long)(local_1024 - (local_e58->begin).z) * local_e58->kstride];
                    local_a28 = local_e10;
                    local_a2c = local_1010;
                    local_a30 = local_fd0;
                    local_a34 = local_1024;
                    computeRhoG::anon_class_16_2_2e1508ad::operator()
                              (&local_eb0,local_f30,local_f38,&local_1018,
                               local_e10->p +
                               (long)(local_1010 - (local_e10->begin).x) +
                               (long)(local_fd0 - (local_e10->begin).y) * local_e10->jstride +
                               (long)(local_1024 - (local_e10->begin).z) * local_e10->kstride);
                    iVar1 = local_1024;
                  }
                }
              }
              else {
                while (local_1020 = iVar1 + -1, local_dd0 <= local_1020) {
                  local_984 = local_1010 + -1;
                  local_980 = local_e58;
                  local_988 = local_fd0;
                  local_98c = local_1020;
                  local_99c = local_1010 + -2;
                  local_998 = local_e58;
                  local_9a0 = local_fd0;
                  local_9a4 = local_1020;
                  local_f30 = (local_e58->p
                               [(long)(local_984 - (local_e58->begin).x) +
                                (long)(local_fd0 - (local_e58->begin).y) * local_e58->jstride +
                                (long)(local_1020 - (local_e58->begin).z) * local_e58->kstride] *
                               3.0 + -local_e58->p
                                      [(long)(local_99c - (local_e58->begin).x) +
                                       (long)(local_fd0 - (local_e58->begin).y) * local_e58->jstride
                                       + (long)(local_1020 - (local_e58->begin).z) *
                                         local_e58->kstride]) * 0.5;
                  local_9b4 = local_1010 + -1;
                  local_9b8 = local_fd0 + 1;
                  local_9b0 = local_e58;
                  local_9bc = local_1020;
                  local_9cc = local_1010 + -2;
                  local_9d0 = local_fd0 + 1;
                  local_9c8 = local_e58;
                  local_9d4 = local_1020;
                  local_f38 = (local_e58->p
                               [(long)(local_9b4 - (local_e58->begin).x) +
                                (long)(local_9b8 - (local_e58->begin).y) * local_e58->jstride +
                                (long)(local_1020 - (local_e58->begin).z) * local_e58->kstride] *
                               3.0 + -local_e58->p
                                      [(long)(local_9cc - (local_e58->begin).x) +
                                       (long)(local_9d0 - (local_e58->begin).y) * local_e58->jstride
                                       + (long)(local_1020 - (local_e58->begin).z) *
                                         local_e58->kstride]) * 0.5;
                  local_9e0 = local_e10;
                  local_9e4 = local_1010;
                  local_9e8 = local_fd0;
                  local_9ec = local_1020;
                  computeRhoG::anon_class_16_2_2e1508ad::operator()
                            (&local_eb0,local_f30,local_f38,&local_1018,
                             local_e10->p +
                             (long)(local_1010 - (local_e10->begin).x) +
                             (long)(local_fd0 - (local_e10->begin).y) * local_e10->jstride +
                             (long)(local_1020 - (local_e10->begin).z) * local_e10->kstride);
                  iVar1 = local_1020;
                }
              }
            }
            else {
              while (local_101c = iVar1 + -1, local_dd0 <= local_101c) {
                local_938 = local_e58;
                local_93c = local_1010;
                local_940 = local_fd0;
                local_944 = local_101c;
                local_f30 = local_e58->p
                            [(long)(local_1010 - (local_e58->begin).x) +
                             (long)(local_fd0 - (local_e58->begin).y) * local_e58->jstride +
                             (long)(local_101c - (local_e58->begin).z) * local_e58->kstride];
                local_958 = local_fd0 + 1;
                local_950 = local_e58;
                local_954 = local_1010;
                local_95c = local_101c;
                local_f38 = local_e58->p
                            [(long)(local_1010 - (local_e58->begin).x) +
                             (long)(local_958 - (local_e58->begin).y) * local_e58->jstride +
                             (long)(local_101c - (local_e58->begin).z) * local_e58->kstride];
                local_968 = local_e10;
                local_96c = local_1010;
                local_970 = local_fd0;
                local_974 = local_101c;
                computeRhoG::anon_class_16_2_2e1508ad::operator()
                          (&local_eb0,local_f30,local_f38,&local_1018,
                           local_e10->p +
                           (long)(local_1010 - (local_e10->begin).x) +
                           (long)(local_fd0 - (local_e10->begin).y) * local_e10->jstride +
                           (long)(local_101c - (local_e10->begin).z) * local_e10->kstride);
                iVar1 = local_101c;
              }
            }
          }
        }
        else {
          for (local_1028 = local_fdc; local_1028 <= local_fe0; local_1028 = local_1028 + 1) {
            local_1030 = 0.0;
            local_1034 = local_df0;
            while (local_1034 = local_1034 + -1, local_dd0 <= local_1034) {
              local_a48 = local_fd0 + -1;
              local_a40 = local_e58;
              local_a44 = local_1028;
              local_a4c = local_1034;
              local_a5c = local_1028 + -1;
              local_a60 = local_fd0 + -1;
              local_a58 = local_e58;
              local_a64 = local_1034;
              local_f30 = (local_e58->p
                           [(long)(local_1028 - (local_e58->begin).x) +
                            (long)(local_a48 - (local_e58->begin).y) * local_e58->jstride +
                            (long)(local_1034 - (local_e58->begin).z) * local_e58->kstride] +
                          local_e58->p
                          [(long)(local_a5c - (local_e58->begin).x) +
                           (long)(local_a60 - (local_e58->begin).y) * local_e58->jstride +
                           (long)(local_1034 - (local_e58->begin).z) * local_e58->kstride]) * 0.5;
              local_a78 = local_fd0 + -1;
              local_a70 = local_e58;
              local_a74 = local_1028;
              local_a7c = local_1034;
              local_a8c = local_1028 + -1;
              local_a90 = local_fd0 + -2;
              local_a88 = local_e58;
              local_a94 = local_1034;
              local_f38 = (local_e58->p
                           [(long)(local_1028 - (local_e58->begin).x) +
                            (long)(local_a78 - (local_e58->begin).y) * local_e58->jstride +
                            (long)(local_1034 - (local_e58->begin).z) * local_e58->kstride] +
                          local_e58->p
                          [(long)(local_a8c - (local_e58->begin).x) +
                           (long)(local_a90 - (local_e58->begin).y) * local_e58->jstride +
                           (long)(local_1034 - (local_e58->begin).z) * local_e58->kstride]) * 0.5;
              local_aa0 = local_e10;
              local_aa4 = local_1028;
              local_aa8 = local_fd0;
              local_aac = local_1034;
              computeRhoG::anon_class_16_2_2e1508ad::operator()
                        (&local_eb0,local_f30,local_f38,&local_1030,
                         local_e10->p +
                         (long)(local_1028 - (local_e10->begin).x) +
                         (long)(local_fd0 - (local_e10->begin).y) * local_e10->jstride +
                         (long)(local_1034 - (local_e10->begin).z) * local_e10->kstride);
            }
          }
          if ((((local_fd1 & 1U) != 0) || ((local_fd3 & 1U) != 0)) || ((local_fd5 & 1U) != 0)) {
            local_1038 = (int)local_dd8;
            local_1040 = 0.0;
            iVar1 = local_df0;
            if ((local_fd1 & 1U) == 0) {
              if ((local_fd3 & 1U) == 0) {
                if ((local_fd5 & 1U) != 0) {
                  while (local_104c = iVar1 + -1, local_dd0 <= local_104c) {
                    local_b80 = local_fd0 + -1;
                    local_b78 = local_e58;
                    local_b7c = local_1038;
                    local_b84 = local_104c;
                    local_f30 = local_e58->p
                                [(long)(local_1038 - (local_e58->begin).x) +
                                 (long)(local_b80 - (local_e58->begin).y) * local_e58->jstride +
                                 (long)(local_104c - (local_e58->begin).z) * local_e58->kstride];
                    local_b98 = local_fd0 + -2;
                    local_b90 = local_e58;
                    local_b94 = local_1038;
                    local_b9c = local_104c;
                    local_f38 = local_e58->p
                                [(long)(local_1038 - (local_e58->begin).x) +
                                 (long)(local_b98 - (local_e58->begin).y) * local_e58->jstride +
                                 (long)(local_104c - (local_e58->begin).z) * local_e58->kstride];
                    local_ba8 = local_e10;
                    local_bac = local_1038;
                    local_bb0 = local_fd0;
                    local_bb4 = local_104c;
                    computeRhoG::anon_class_16_2_2e1508ad::operator()
                              (&local_eb0,local_f30,local_f38,&local_1040,
                               local_e10->p +
                               (long)(local_1038 - (local_e10->begin).x) +
                               (long)(local_fd0 - (local_e10->begin).y) * local_e10->jstride +
                               (long)(local_104c - (local_e10->begin).z) * local_e10->kstride);
                    iVar1 = local_104c;
                  }
                }
              }
              else {
                while (local_1048 = iVar1 + -1, local_dd0 <= local_1048) {
                  local_b08 = local_fd0 + -1;
                  local_b00 = local_e58;
                  local_b04 = local_1038;
                  local_b0c = local_1048;
                  local_b1c = local_1038 + 1;
                  local_b20 = local_fd0 + -1;
                  local_b18 = local_e58;
                  local_b24 = local_1048;
                  local_f30 = (local_e58->p
                               [(long)(local_1038 - (local_e58->begin).x) +
                                (long)(local_b08 - (local_e58->begin).y) * local_e58->jstride +
                                (long)(local_1048 - (local_e58->begin).z) * local_e58->kstride] *
                               3.0 + -local_e58->p
                                      [(long)(local_b1c - (local_e58->begin).x) +
                                       (long)(local_b20 - (local_e58->begin).y) * local_e58->jstride
                                       + (long)(local_1048 - (local_e58->begin).z) *
                                         local_e58->kstride]) * 0.5;
                  local_b38 = local_fd0 + -2;
                  local_b30 = local_e58;
                  local_b34 = local_1038;
                  local_b3c = local_1048;
                  local_b4c = local_1038 + 1;
                  local_b50 = local_fd0 + -2;
                  local_b48 = local_e58;
                  local_b54 = local_1048;
                  local_f38 = (local_e58->p
                               [(long)(local_1038 - (local_e58->begin).x) +
                                (long)(local_b38 - (local_e58->begin).y) * local_e58->jstride +
                                (long)(local_1048 - (local_e58->begin).z) * local_e58->kstride] *
                               3.0 + -local_e58->p
                                      [(long)(local_b4c - (local_e58->begin).x) +
                                       (long)(local_b50 - (local_e58->begin).y) * local_e58->jstride
                                       + (long)(local_1048 - (local_e58->begin).z) *
                                         local_e58->kstride]) * 0.5;
                  local_b60 = local_e10;
                  local_b64 = local_1038;
                  local_b68 = local_fd0;
                  local_b6c = local_1048;
                  computeRhoG::anon_class_16_2_2e1508ad::operator()
                            (&local_eb0,local_f30,local_f38,&local_1040,
                             local_e10->p +
                             (long)(local_1038 - (local_e10->begin).x) +
                             (long)(local_fd0 - (local_e10->begin).y) * local_e10->jstride +
                             (long)(local_1048 - (local_e10->begin).z) * local_e10->kstride);
                  iVar1 = local_1048;
                }
              }
            }
            else {
              while (local_1044 = iVar1 + -1, local_dd0 <= local_1044) {
                local_abc = local_1038 + -1;
                local_ac0 = local_fd0 + -1;
                local_ab8 = local_e58;
                local_ac4 = local_1044;
                local_f30 = local_e58->p
                            [(long)(local_abc - (local_e58->begin).x) +
                             (long)(local_ac0 - (local_e58->begin).y) * local_e58->jstride +
                             (long)(local_1044 - (local_e58->begin).z) * local_e58->kstride];
                local_ad4 = local_1038 + -2;
                local_ad8 = local_fd0 + -1;
                local_ad0 = local_e58;
                local_adc = local_1044;
                local_f38 = local_e58->p
                            [(long)(local_ad4 - (local_e58->begin).x) +
                             (long)(local_ad8 - (local_e58->begin).y) * local_e58->jstride +
                             (long)(local_1044 - (local_e58->begin).z) * local_e58->kstride];
                local_ae8 = local_e10;
                local_aec = local_1038;
                local_af0 = local_fd0;
                local_af4 = local_1044;
                computeRhoG::anon_class_16_2_2e1508ad::operator()
                          (&local_eb0,local_f30,local_f38,&local_1040,
                           local_e10->p +
                           (long)(local_1038 - (local_e10->begin).x) +
                           (long)(local_fd0 - (local_e10->begin).y) * local_e10->jstride +
                           (long)(local_1044 - (local_e10->begin).z) * local_e10->kstride);
                iVar1 = local_1044;
              }
            }
          }
          if ((((local_fd2 & 1U) != 0) || ((local_fd4 & 1U) != 0)) || ((local_fd6 & 1U) != 0)) {
            local_1050 = (int)local_df8;
            local_1058 = 0.0;
            local_105c = local_df0;
            if ((local_fd2 & 1U) == 0) {
              local_1060 = local_df0;
              if ((local_fd4 & 1U) == 0) {
                local_1064 = local_df0;
                if ((local_fd6 & 1U) != 0) {
                  while (local_1064 = local_1064 + -1, local_dd0 <= local_1064) {
                    local_c84 = local_1050 + -1;
                    local_c88 = local_fd0 + -1;
                    local_c80 = local_e58;
                    local_c8c = local_1064;
                    local_f30 = local_e58->p
                                [(long)(local_c84 - (local_e58->begin).x) +
                                 (long)(local_c88 - (local_e58->begin).y) * local_e58->jstride +
                                 (long)(local_1064 - (local_e58->begin).z) * local_e58->kstride];
                    local_c9c = local_1050 + -1;
                    local_ca0 = local_fd0 + -2;
                    local_c98 = local_e58;
                    local_ca4 = local_1064;
                    local_f38 = local_e58->p
                                [(long)(local_c9c - (local_e58->begin).x) +
                                 (long)(local_ca0 - (local_e58->begin).y) * local_e58->jstride +
                                 (long)(local_1064 - (local_e58->begin).z) * local_e58->kstride];
                    local_cb0 = local_e10;
                    local_cb4 = local_1050;
                    local_cb8 = local_fd0;
                    local_cbc = local_1064;
                    computeRhoG::anon_class_16_2_2e1508ad::operator()
                              (&local_eb0,local_f30,local_f38,&local_1058,
                               local_e10->p +
                               (long)(local_1050 - (local_e10->begin).x) +
                               (long)(local_fd0 - (local_e10->begin).y) * local_e10->jstride +
                               (long)(local_1064 - (local_e10->begin).z) * local_e10->kstride);
                  }
                }
              }
              else {
                while (local_1060 = local_1060 + -1, local_dd0 <= local_1060) {
                  local_c0c = local_1050 + -1;
                  local_c10 = local_fd0 + -1;
                  local_c08 = local_e58;
                  local_c14 = local_1060;
                  local_c24 = local_1050 + -2;
                  local_c28 = local_fd0 + -1;
                  local_c20 = local_e58;
                  local_c2c = local_1060;
                  local_f30 = (local_e58->p
                               [(long)(local_c0c - (local_e58->begin).x) +
                                (long)(local_c10 - (local_e58->begin).y) * local_e58->jstride +
                                (long)(local_1060 - (local_e58->begin).z) * local_e58->kstride] *
                               3.0 + -local_e58->p
                                      [(long)(local_c24 - (local_e58->begin).x) +
                                       (long)(local_c28 - (local_e58->begin).y) * local_e58->jstride
                                       + (long)(local_1060 - (local_e58->begin).z) *
                                         local_e58->kstride]) * 0.5;
                  local_c3c = local_1050 + -1;
                  local_c40 = local_fd0 + -2;
                  local_c38 = local_e58;
                  local_c44 = local_1060;
                  local_c54 = local_1050 + -2;
                  local_c58 = local_fd0 + -2;
                  local_c50 = local_e58;
                  local_c5c = local_1060;
                  local_f38 = (local_e58->p
                               [(long)(local_c3c - (local_e58->begin).x) +
                                (long)(local_c40 - (local_e58->begin).y) * local_e58->jstride +
                                (long)(local_1060 - (local_e58->begin).z) * local_e58->kstride] *
                               3.0 + -local_e58->p
                                      [(long)(local_c54 - (local_e58->begin).x) +
                                       (long)(local_c58 - (local_e58->begin).y) * local_e58->jstride
                                       + (long)(local_1060 - (local_e58->begin).z) *
                                         local_e58->kstride]) * 0.5;
                  local_c68 = local_e10;
                  local_c6c = local_1050;
                  local_c70 = local_fd0;
                  local_c74 = local_1060;
                  computeRhoG::anon_class_16_2_2e1508ad::operator()
                            (&local_eb0,local_f30,local_f38,&local_1058,
                             local_e10->p +
                             (long)(local_1050 - (local_e10->begin).x) +
                             (long)(local_fd0 - (local_e10->begin).y) * local_e10->jstride +
                             (long)(local_1060 - (local_e10->begin).z) * local_e10->kstride);
                }
              }
            }
            else {
              while (local_105c = local_105c + -1, local_dd0 <= local_105c) {
                local_bc8 = local_fd0 + -1;
                local_bc0 = local_e58;
                local_bc4 = local_1050;
                local_bcc = local_105c;
                local_f30 = local_e58->p
                            [(long)(local_1050 - (local_e58->begin).x) +
                             (long)(local_bc8 - (local_e58->begin).y) * local_e58->jstride +
                             (long)(local_105c - (local_e58->begin).z) * local_e58->kstride];
                local_be0 = local_fd0 + -2;
                local_bd8 = local_e58;
                local_bdc = local_1050;
                local_be4 = local_105c;
                local_f38 = local_e58->p
                            [(long)(local_1050 - (local_e58->begin).x) +
                             (long)(local_be0 - (local_e58->begin).y) * local_e58->jstride +
                             (long)(local_105c - (local_e58->begin).z) * local_e58->kstride];
                local_bf0 = local_e10;
                local_bf4 = local_1050;
                local_bf8 = local_fd0;
                local_bfc = local_105c;
                computeRhoG::anon_class_16_2_2e1508ad::operator()
                          (&local_eb0,local_f30,local_f38,&local_1058,
                           local_e10->p +
                           (long)(local_1050 - (local_e10->begin).x) +
                           (long)(local_fd0 - (local_e10->begin).y) * local_e10->jstride +
                           (long)(local_105c - (local_e10->begin).z) * local_e10->kstride);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
Projection::computeRhoG(FArrayBox*         rhoFab,
			FArrayBox*         phiFab,
			const Geometry&    geom,
			Orientation*       outFaces,
			int                numOutFlowFaces,
			Real               gravity)
{
    AMREX_ASSERT(std::fabs(gravity) > 0.);

    for (int iface = 0; iface < numOutFlowFaces; iface++)
    {
      int outDir             = outFaces[iface].coordDir();
      Orientation::Side side = outFaces[iface].faceDir();

      if (outDir == (AMREX_SPACEDIM-1))
      {
	  if (side == Orientation::high) {
	    //
	    // Hydrostatic pressure == 0 here, given IAMR definition of gravity.
	    // Do nothing, since phi already initialized to zero
	    //
	  } else {
	    amrex::Abort("Projection::computeRhoG : Simulation box has outflow boundary condition on the bottom and gravity != 0. If this is really the desired configuration, just comment out this Abort");
	  }
      }
      else // integrate rho * g* dh
      {
	  const auto   lo = amrex::lbound(phiFab[iface].box());
	  const auto   hi = amrex::ubound(phiFab[iface].box());
	  const auto& phi = phiFab[iface].array();
	  const auto& rho = rhoFab[iface].array();
	  const Real dh = geom.CellSize(AMREX_SPACEDIM-1);

	  auto add_rhog = [gravity, dh] ( Real rho1, Real rho2,
					  Real& rhog_i, Real& phi_i )
	  {
	    Real rhoExt = 0.5*(3.*rho1-rho2);
	    rhog_i -= gravity * rhoExt * dh;
	    phi_i  += rhog_i;
	  };


#if (AMREX_SPACEDIM == 2)
	  //
	  // Only possibilities are XLO face or XHI
	  //
	  // Ok to only use low index of phi because phi is only one
	  // node wide in i-direction.
	  //
	  AMREX_ASSERT( lo.x==hi.x );
	  int i = lo.x;

	  Real rhog = 0.;
	  //
	  // Note that the integral here prevents parallelization
	  //
	  if (side == Orientation::low)
	  {
	    for (int j = hi.y-1; j >= lo.y; j--) {
	      add_rhog(rho(i,j,0),rho(i+1,j,0),rhog,phi(i,j,0));
	    }
	  }
	  else
	  {
	    for (int j = hi.y-1; j >= lo.y; j--) {
	      add_rhog(rho(i-1,j,0),rho(i-2,j,0),rhog,phi(i,j,0));
	    }
	  }
#else
	  const Box& domain = geom.Domain();
	  const auto domlo = amrex::lbound(domain);
	  const auto domhi = amrex::ubound(domain);

	  // fixme? Could make use of NSB::m_bcrec_scalars here.
	  int        lo_bc[AMREX_SPACEDIM];
	  int        hi_bc[AMREX_SPACEDIM];
	  //
	  // change from phys_bcs of Inflow, SlipWall, etc.
	  // to mathematical bcs of EXT_DIR, FOEXTRAP, etc.
	  //
	  for (int i = 0; i < AMREX_SPACEDIM; i++)
	  {
	      const int* lbc = phys_bc->lo();
	      const int* hbc = phys_bc->hi();

	      lo_bc[i]=scalar_bc[lbc[i]];
	      hi_bc[i]=scalar_bc[hbc[i]];
	  }

	  //
	  // fixme? - TODO: Could parallelize here by dividing the loop over i (or j)
	  // only and thus the k integration stays intact. However, would want to move
	  // this declaration of rho_i, rho_ii to ensure each k integration has it's own
	  // copy.
	  //
	  Real rho_i, rho_ii;

	  if ( outDir == int(Direction::x) )
	  {
	      //
	      // Ok to only use low index of phi because phi is only one
	      // node wide in i-direction.
	      //
	      AMREX_ASSERT( lo.x==hi.x );
	      int i = lo.x;

	      bool has_extdir_lo = (lo.y==domlo.y   && lo_bc[1]==BCType::ext_dir);
	      bool has_extdir_hi = (hi.y==domhi.y+1 && hi_bc[1]==BCType::ext_dir);
	      bool has_hoextrap_lo = (lo.y==domlo.y   && lo_bc[1]==BCType::hoextrap);
	      bool has_hoextrap_hi = (hi.y==domhi.y+1 && hi_bc[1]==BCType::hoextrap);
	      bool has_foextrap_lo = (lo.y==domlo.y   && lo_bc[1]==BCType::foextrap);
	      bool has_foextrap_hi = (hi.y==domhi.y+1 && hi_bc[1]==BCType::foextrap);

	      //
	      // If there are any of the above mentioned bcs, then we'll need to handle
	      // edges separately in accordance with those conditions, so set bounds for
	      // loop over j accordingly.
	      //
	      int jlo, jhi;
	      if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo ) {
		jlo = lo.y+1;
	      } else {
		jlo = lo.y;
	      }
	      if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi ) {
		jhi = hi.y-1;
	      } else {
		jhi = hi.y;
	      }

	      //
	      // xlo face
	      //
	      if (side == Orientation::low)
	      {
		for (int j = jlo; j <= jhi; j++)
		{
		  Real rhog = 0.;

		  for (int k = hi.z-1; k >= lo.z; k--) {
		    rho_i  = 0.5 * (rho(i  ,j,k) + rho(i  ,j-1,k));
		    rho_ii = 0.5 * (rho(i+1,j,k) + rho(i+1,j-1,k));
		    add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		  }
		}
		//
		// Now compute y-edges if needed
		//
		if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo )
		{
		  int j = lo.y;
		  Real rhog = 0.;

		  if ( has_extdir_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = rho(i  ,j-1,k);
		      rho_ii = rho(i+1,j-1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = 0.5*(3.*rho(i  ,j,k) - rho(i  ,j+1,k));
		      rho_ii = 0.5*(3.*rho(i+1,j,k) - rho(i+1,j+1,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = rho(i  ,j,k);
		      rho_ii = rho(i+1,j,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}

		if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi )
		{
		  int j = hi.y;
		  Real rhog = 0;

		  if ( has_extdir_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = rho(i  ,j,k);
		      rho_ii = rho(i+1,j,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = 0.5*(3.*rho(i  ,j-1,k) - rho(i  ,j-2,k));
		      rho_ii = 0.5*(3.*rho(i+1,j-1,k) - rho(i+1,j-2,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i  = rho(i  ,j-1,k);
		      rho_ii = rho(i+1,j-1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}
	      }
	      else // xhi face
	      {
		for (int j = jlo; j <= jhi; j++)
		{
		  Real rhog = 0.;

		  for (int k = hi.z-1; k >= lo.z; k--) {
		    rho_i   = 0.5 * (rho(i-1,j,k) + rho(i-1,j-1,k));
		    rho_ii = 0.5 * (rho(i-2,j,k) + rho(i-2,j-1,k));
		    add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		  }
		}
		//
		// Now compute y-edges if needed
		//
		if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo )
		{
		  int j = lo.y;
		  Real rhog = 0.;

		  if ( has_extdir_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j-1,k);
		      rho_ii = rho(i-2,j-1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i-1,j,k) - rho(i-1,j+1,k));
		      rho_ii = 0.5*(3.*rho(i-2,j,k) - rho(i-2,j+1,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j,k);
		      rho_ii = rho(i-2,j,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}

		if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi )
		{
		  int j = hi.y;
		  Real rhog = 0;

		  if ( has_extdir_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j,k);
		      rho_ii = rho(i-2,j,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i-1,j-1,k) - rho(i-1,j-2,k));
		      rho_ii = 0.5*(3.*rho(i-2,j-1,k) - rho(i-2,j-2,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j-1,k);
		      rho_ii = rho(i-2,j-1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}
	      }
	  }
	  else // ( outDir == Direction::y )
	  {
	      //
	      // Ok to only use low index of phi because phi is only one
	      // node wide in i-direction.
	      //
	      AMREX_ASSERT( lo.y==hi.y );
	      int j = lo.y;

	      bool has_extdir_lo = (lo.x==domlo.x   && lo_bc[0]==BCType::ext_dir);
	      bool has_extdir_hi = (hi.x==domhi.x+1 && hi_bc[0]==BCType::ext_dir);
	      bool has_hoextrap_lo = (lo.x==domlo.x   && lo_bc[0]==BCType::hoextrap);
	      bool has_hoextrap_hi = (hi.x==domhi.x+1 && hi_bc[0]==BCType::hoextrap);
	      bool has_foextrap_lo = (lo.x==domlo.x   && lo_bc[0]==BCType::foextrap);
	      bool has_foextrap_hi = (hi.x==domhi.x+1 && hi_bc[0]==BCType::foextrap);
	      //
	      // If there are any of the above mentioned bcs, then we'll need to handle
	      // edges separately in accordance with those conditions, so set bounds for
	      // loop over i accordingly.
	      //
	      int ilo, ihi;
	      if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo ) {
		ilo = lo.x+1;
	      } else {
		ilo = lo.x;
	      }
	      if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi ) {
		ihi = hi.x-1;
	      } else {
		ihi = hi.x;
	      }
	      //
	      // ylo face
	      //
	      if (side == Orientation::low)
	      {
		for (int i = ilo; i <= ihi; i++)
		{
		  Real rhog = 0.;

		  for (int k = hi.z-1; k >= lo.z; k--) {
		    rho_i   = 0.5 * (rho(i,j  ,k) + rho(i-1,j ,k));
		    rho_ii = 0.5 * (rho(i,j+1,k) + rho(i-1,j+1,k));
		    add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		  }
		}
		//
		// Now compute x-edges if needed
		//
		if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo )
		{
		  int i = lo.x;
		  Real rhog = 0.;

		  if ( has_extdir_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j  ,k);
		      rho_ii = rho(i-1,j+1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i,j  ,k) - rho(i+1,j  ,k));
		      rho_ii = 0.5*(3.*rho(i,j+1,k) - rho(i+1,j+1,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i,j  ,k);
		      rho_ii = rho(i,j+1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}

		if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi )
		{
		  int i = hi.x;
		  Real rhog = 0;

		  if ( has_extdir_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i,j  ,k);
		      rho_ii = rho(i,j+1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i-1,j  ,k) - rho(i-2,j  ,k));
		      rho_ii = 0.5*(3.*rho(i-1,j+1,k) - rho(i-2,j+1,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j  ,k);
		      rho_ii = rho(i-1,j+1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}
	      }
	      else // yhi face
	      {
		for (int i = ilo; i <= ihi; i++)
		{
		  Real rhog = 0.;

		  for (int k = hi.z-1; k >= lo.z; k--) {
		    rho_i   = 0.5 * (rho(i,j-1,k) + rho(i-1,j-1,k));
		    rho_ii = 0.5 * (rho(i,j-1,k) + rho(i-1,j-2,k));
		    add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		  }
		}
		//
		// Now compute y-edges if needed
		//
		if ( has_extdir_lo || has_hoextrap_lo || has_foextrap_lo )
		{
		  int i = lo.x;
		  Real rhog = 0.;

		  if ( has_extdir_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j-1,k);
		      rho_ii = rho(i-2,j-1,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i,j-1,k) - rho(i+1,j-1,k));
		      rho_ii = 0.5*(3.*rho(i,j-2,k) - rho(i+1,j-2,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_lo ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i,j-1,k);
		      rho_ii = rho(i,j-2,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}

		if ( has_extdir_hi || has_hoextrap_hi || has_foextrap_hi )
		{
		  int i = hi.x;
		  Real rhog = 0;

		  if ( has_extdir_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i,j-1,k);
		      rho_ii = rho(i,j-2,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_hoextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = 0.5*(3.*rho(i-1,j-1,k) - rho(i-2,j-1,k));
		      rho_ii = 0.5*(3.*rho(i-1,j-2,k) - rho(i-2,j-2,k));
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  } else if ( has_foextrap_hi ) {
		    for (int k = hi.z-1; k >= lo.z; k--) {
		      rho_i   = rho(i-1,j-1,k);
		      rho_ii = rho(i-1,j-2,k);
		      add_rhog(rho_i, rho_ii, rhog, phi(i,j,k));
		    }
		  }
		}
	      } // endif over hi/low sides
	  } // endif over directions
#endif
      } // endif integrate rho*g*dh
    } // end loop over outflow faces
}